

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O0

void __thiscall
Eigen::DenseBase<Eigen::Matrix<float,32,1,0,32,1>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,32,1,0,32,1>>>
          (DenseBase<Eigen::Matrix<float,32,1,0,32,1>> *this,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  Matrix<float,_32,_1,_0,_32,_1> *xpr;
  undefined1 local_30 [8];
  ThisEvaluator thisEval;
  max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor_local;
  DenseBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *this_local;
  
  thisEval.m_xpr = (Matrix<float,_32,_1,_0,_32,_1> *)visitor;
  xpr = EigenBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>::derived
                  ((EigenBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *)this);
  internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>::visitor_evaluator
            ((visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *)local_30,xpr);
  internal::
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_32>
  ::run((visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *)local_30,
        (max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *)thisEval.m_xpr);
  internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>::~visitor_evaluator
            ((visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());
  
  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * ThisEvaluator::CoeffReadCost + (SizeAtCompileTime-1) * internal::functor_traits<Visitor>::Cost <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}